

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

BMP * __thiscall BMP::getUmCode_abi_cxx11_(BMP *this,int a,int n)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long lVar3;
  int in_ECX;
  int n_local;
  int a_local;
  BMP *this_local;
  string *x;
  
  getBit_abi_cxx11_(this,a);
  _Var1._M_current = (char *)std::__cxx11::string::begin();
  _Var2._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var1,_Var2);
  while (lVar3 = std::__cxx11::string::size(), lVar3 != in_ECX) {
    std::__cxx11::string::operator+=((string *)this,'0');
  }
  _Var1._M_current = (char *)std::__cxx11::string::begin();
  _Var2._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(_Var1,_Var2);
  return this;
}

Assistant:

std::string BMP::getUmCode(int a, int n)
{
    using namespace std;

    string x = getBit( a );

    reverse( x.begin(), x.end() );

    while ( x.size() != n )
        x += '0';

    reverse( x.begin(), x.end() );

    return x;
}